

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O1

void __thiscall
helics::BrokerFactory::addAssociatedBrokerType(BrokerFactory *this,string_view name,CoreType type)

{
  string sname;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,name._M_len,this + name._M_len);
  gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addType
            ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)searchableBrokers,&local_38
             ,(CoreType)name._M_str);
  addExtraTypes(&local_38,(CoreType)name._M_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void addAssociatedBrokerType(std::string_view name, CoreType type)
{
    const std::string sname{name};
    searchableBrokers.addType(sname, type);
    addExtraTypes(sname, type);
}